

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall
Options::add_entry<std::__cxx11::string&>
          (Options *this,option *opt,char flag,string *long_flag,string *description,string *group,
          bool req_arg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  option *poVar5;
  iterator iVar6;
  ostream *poVar7;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  runtime_error *prVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ushort uVar11;
  uint uVar12;
  size_type __n;
  int iVar13;
  ulong uVar14;
  size_type sVar15;
  bool bVar16;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  string desc;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  option *local_240;
  ulong local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  Options *local_210;
  string *local_208;
  ulong local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  long *local_1d8;
  uint local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_240 = opt;
  local_208 = group;
  if (flag == '\0') {
    if (long_flag->_M_string_length == 0) {
      return;
    }
    iVar13 = this->optval;
    this->optval = iVar13 + 1;
  }
  else {
    iVar13 = (int)flag;
    p_Var1 = &(this->setters)._M_t._M_impl.super__Rb_tree_header;
    p_Var10 = (this->setters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var9 = &p_Var1->_M_header;
    for (; p_Var10 != (_Base_ptr)0x0;
        p_Var10 = (&p_Var10->_M_left)[(int)p_Var10[1]._M_color < iVar13]) {
      if (iVar13 <= (int)p_Var10[1]._M_color) {
        p_Var9 = p_Var10;
      }
    }
    p_Var10 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
       (p_Var10 = p_Var9, iVar13 < (int)p_Var9[1]._M_color)) {
      p_Var10 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var10 != p_Var1) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Duplicate flag \'",0x10);
      local_260._M_dataplus._M_p._0_1_ = flag;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_260,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_260);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->optstr,flag);
    if (req_arg) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&this->optstr,":");
    }
  }
  poVar5 = local_240;
  local_240->val = iVar13;
  if (long_flag->_M_string_length != 0) {
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->long_flags)._M_t,long_flag);
    if ((_Rb_tree_header *)iVar6._M_node != &(this->long_flags)._M_t._M_impl.super__Rb_tree_header)
    {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Duplicate long flag \"",0x15);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(long_flag->_M_dataplus)._M_p,long_flag->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar8,(string *)&local_260);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pVar17 = std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->long_flags,long_flag);
    poVar5->name = *(char **)(pVar17.first._M_node._M_node + 1);
  }
  poVar5->flag = (int *)0x0;
  if (description->_M_string_length != 0) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    paVar2 = &local_260.field_2;
    local_260._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_260,(ulong)this->IndentFlag,' ');
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if (flag != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"-",1);
      local_260._M_dataplus._M_p._0_1_ = flag;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_260,1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    }
    if (long_flag->_M_string_length != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"--",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(long_flag->_M_dataplus)._M_p,long_flag->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
    }
    std::__cxx11::stringbuf::str();
    sVar15 = local_280._M_string_length;
    uVar14 = (ulong)this->IndentDescription;
    __n = 1;
    if (local_280._M_string_length <= uVar14) {
      std::__cxx11::stringbuf::str();
      __n = uVar14 - local_1f0;
    }
    local_260._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_260,__n,' ');
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != paVar2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((sVar15 <= uVar14) && (local_1f8 != local_1e8)) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    puVar4 = (undefined1 *)
             CONCAT44(local_280._M_dataplus._M_p._4_4_,
                      CONCAT22(local_280._M_dataplus._M_p._2_2_,
                               CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                        local_280._M_dataplus._M_p._0_1_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_280.field_2) {
      operator_delete(puVar4,local_280.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = (description->_M_dataplus)._M_p;
    local_260._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar3,pcVar3 + description->_M_string_length);
    ioctl(0,0x5413,&local_280);
    uVar11 = 0x50;
    if (0x27 < local_280._M_dataplus._M_p._2_2_) {
      uVar11 = local_280._M_dataplus._M_p._2_2_;
    }
    std::__cxx11::stringbuf::str();
    local_240 = (option *)CONCAT44(local_240._4_4_,(float)(uVar11 - local_280._M_string_length));
    local_238 = CONCAT44(local_238._4_4_,(float)uVar11 * 0.3);
    if ((float)(uVar11 - local_280._M_string_length) <= (float)uVar11 * 0.3) {
      uVar12 = this->IndentFlag + 2;
    }
    else {
      std::__cxx11::stringbuf::str();
      uVar12 = local_1d0;
    }
    if (((float)local_238 < local_240._0_4_) && (local_1d8 != local_1c8)) {
      operator_delete(local_1d8,local_1c8[0] + 1);
    }
    puVar4 = (undefined1 *)
             CONCAT44(local_280._M_dataplus._M_p._4_4_,
                      CONCAT22(local_280._M_dataplus._M_p._2_2_,
                               CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                        local_280._M_dataplus._M_p._0_1_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_280.field_2) {
      operator_delete(puVar4,local_280.field_2._M_allocated_capacity + 1);
    }
    if (uVar12 == this->IndentFlag + 2) {
      local_280._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_280,1);
    }
    local_210 = this;
    if (local_260._M_string_length != 0) {
      local_240 = (option *)(ulong)(uVar11 - uVar12);
      paVar2 = &local_230.field_2;
      local_200 = (ulong)uVar12;
      sVar15 = 0;
      local_238 = (ulong)local_240;
      do {
        while( true ) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_280,&local_260,sVar15,1);
          local_230._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_230," ","");
          if (local_280._M_string_length == local_230._M_string_length) {
            if (local_280._M_string_length == 0) {
              bVar16 = true;
            }
            else {
              iVar13 = bcmp((void *)CONCAT44(local_280._M_dataplus._M_p._4_4_,
                                             CONCAT22(local_280._M_dataplus._M_p._2_2_,
                                                      CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                                               local_280._M_dataplus._M_p._0_1_))),
                            local_230._M_dataplus._M_p,local_280._M_string_length);
              bVar16 = iVar13 == 0;
            }
          }
          else {
            bVar16 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != paVar2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          puVar4 = (undefined1 *)
                   CONCAT44(local_280._M_dataplus._M_p._4_4_,
                            CONCAT22(local_280._M_dataplus._M_p._2_2_,
                                     CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                              local_280._M_dataplus._M_p._0_1_)));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar4 != &local_280.field_2) {
            operator_delete(puVar4,local_280.field_2._M_allocated_capacity + 1);
          }
          if (!bVar16) break;
          sVar15 = (ulong)((int)sVar15 + 1);
        }
        uVar14 = (ulong)(uint)((int)local_240 + (int)sVar15);
        if (uVar14 < local_260._M_string_length) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_280,&local_260,sVar15,local_238);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,
                              (char *)CONCAT44(local_280._M_dataplus._M_p._4_4_,
                                               CONCAT22(local_280._M_dataplus._M_p._2_2_,
                                                        CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                                                 local_280._M_dataplus._M_p._0_1_)))
                              ,local_280._M_string_length);
          local_230._M_dataplus._M_p._0_1_ = 10;
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_230,1);
          local_230._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_230,local_200,' ');
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,local_230._M_dataplus._M_p,local_230._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != paVar2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (&local_280,&local_260,sVar15,0xffffffffffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     (char *)CONCAT44(local_280._M_dataplus._M_p._4_4_,
                                      CONCAT22(local_280._M_dataplus._M_p._2_2_,
                                               CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                                        local_280._M_dataplus._M_p._0_1_))),
                     local_280._M_string_length);
        }
        puVar4 = (undefined1 *)
                 CONCAT44(local_280._M_dataplus._M_p._4_4_,
                          CONCAT22(local_280._M_dataplus._M_p._2_2_,
                                   CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                            local_280._M_dataplus._M_p._0_1_)));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar4 != &local_280.field_2) {
          operator_delete(puVar4,local_280.field_2._M_allocated_capacity + 1);
        }
        sVar15 = uVar14;
      } while (uVar14 < local_260._M_string_length);
    }
    this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&local_210->usage,local_208);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,&local_280);
    puVar4 = (undefined1 *)
             CONCAT44(local_280._M_dataplus._M_p._4_4_,
                      CONCAT22(local_280._M_dataplus._M_p._2_2_,
                               CONCAT11(local_280._M_dataplus._M_p._1_1_,
                                        local_280._M_dataplus._M_p._0_1_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &local_280.field_2) {
      operator_delete(puVar4,local_280.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

inline void Options::add_entry(struct option& opt, char flag, std::string long_flag, std::string description, std::string group, bool req_arg) {
    if (!flag && !long_flag.size()) return;

    if (flag) {
        if (this->setters.find((int)(flag)) != this->setters.end()) {
            std::stringstream ss;
            ss << "Duplicate flag '" << flag << "'";
            throw std::runtime_error(ss.str());
        }
        this->optstr += flag;
        if (req_arg) this->optstr += ":";

        opt.val = flag;
    } else {
        opt.val = this->optval++;
    }

    if (long_flag.size()) {
        if (this->long_flags.find(long_flag) != this->long_flags.end()) {
            std::stringstream ss;
            ss << "Duplicate long flag \"" << long_flag << "\"";
            throw std::runtime_error(ss.str());
        }
        opt.name = this->long_flags.insert(long_flag).first->c_str();
    }
    opt.flag = NULL;

    if (description.size()) {
        std::stringstream ss;
        ss << std::string(IndentFlag, ' ');

        if (flag) ss << "-" << flag << " ";
        if (long_flag.size()) ss << "--" << long_flag << " ";
        ss << std::string(ss.str().length() > IndentDescription ? 1 : IndentDescription - ss.str().length(), ' ');

        std::string desc(description);
        if (std::is_same<T, bool&>::value) desc.append(std::string(" <switch>"));

        unsigned width = tty_width();
        unsigned desc_pos = width - ss.str().length() > width * 0.3f ? (unsigned)ss.str().length() : IndentFlag + 2;
        unsigned column_width = width - desc_pos;
        if (desc_pos == IndentFlag + 2) ss << '\n';

        for (unsigned i = 0; i < desc.size(); i += column_width) {
            while (desc.substr(i, 1) == std::string(" ")) ++i;
            if (i + column_width < desc.size()) {
                ss << desc.substr(i, column_width) << '\n' << std::string(desc_pos, ' ');
            } else {
                ss << desc.substr(i);
            }
        }

        this->usage[group].push_back(ss.str());
    }
}